

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall ASN1Test_DoublyTagged_Test::TestBody(ASN1Test_DoublyTagged_Test *this)

{
  bool bVar1;
  DOUBLY_TAGGED *pDVar2;
  char *pcVar3;
  pointer pDVar4;
  char *in_R9;
  Span<const_unsigned_char> local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c8;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  string local_80;
  AssertHelper local_60;
  Message local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  uint8_t *local_30;
  uint8_t *inp;
  undefined1 local_20 [8];
  unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> obj;
  ASN1Test_DoublyTagged_Test *this_local;
  
  inp = (uint8_t *)DOUBLY_TAGGED_free;
  obj._M_t.super___uniq_ptr_impl<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>._M_t.
  super__Tuple_impl<0UL,_DOUBLY_TAGGED_*,_void_(*)(DOUBLY_TAGGED_*)>.
  super__Head_base<0UL,_DOUBLY_TAGGED_*,_false>._M_head_impl = (DOUBLY_TAGGED *)this;
  std::unique_ptr<DOUBLY_TAGGED,void(*)(DOUBLY_TAGGED*)>::unique_ptr<void(*)(DOUBLY_TAGGED*),void>
            ((unique_ptr<DOUBLY_TAGGED,void(*)(DOUBLY_TAGGED*)> *)local_20,(pointer)0x0,
             (__enable_if_t<_is_lvalue_reference<void_(*)(DOUBLY_TAGGED_*)>::value,_void_(*&&)(DOUBLY_TAGGED_*)>
              )&inp);
  local_30 = "0";
  pDVar2 = d2i_DOUBLY_TAGGED((DOUBLY_TAGGED **)0x0,&local_30,2);
  std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::reset
            ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20,pDVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<DOUBLY_TAGGED,void(*)(DOUBLY_TAGGED*)>>
            ((AssertionResult *)local_50,
             (unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_50,(AssertionResult *)0x8733ab,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0xb28,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::Message::~Message(&local_58);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pDVar4 = std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::operator->
                       ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20);
    local_9c = -1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_98,"obj->b","-1",&pDVar4->b,&local_9c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xb29,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    pDVar4 = std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::operator->
                       ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20);
    local_c1 = pDVar4->oct == (ASN1_OCTET_STRING *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_c0,&local_c1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_f8,(internal *)local_c0,(AssertionResult *)"obj->oct","true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xb2a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      testing::Message::~Message(&local_d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    pDVar4 = std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::get
                       ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20);
    bssl::Span<unsigned_char_const>::Span<2ul>
              ((Span<unsigned_char_const> *)&gtest_ar__2.message_,(uchar (*) [2])"0");
    TestSerialize<DOUBLY_TAGGED*,DOUBLY_TAGGED*>(pDVar4,i2d_DOUBLY_TAGGED,stack0xfffffffffffffef8);
    local_30 = TestBody::kTrueEmpty;
    pDVar2 = d2i_DOUBLY_TAGGED((DOUBLY_TAGGED **)0x0,&local_30,0xf);
    std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::reset
              ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20,pDVar2);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<DOUBLY_TAGGED,void(*)(DOUBLY_TAGGED*)>>
              ((AssertionResult *)local_118,
               (unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_118,(AssertionResult *)0x8733ab,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xb33,pcVar3);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_120);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pDVar4 = std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::operator->
                         ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20);
      local_15c = 0xff;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_158,"obj->b","0xff",&pDVar4->b,&local_15c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
      if (!bVar1) {
        testing::Message::Message(&local_168);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xb34,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_168)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_168);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
      pDVar4 = std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::operator->
                         ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20);
      testing::AssertionResult::AssertionResult<asn1_string_st*>
                ((AssertionResult *)local_180,&pDVar4->oct,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_188);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_180,
                   (AssertionResult *)"obj->oct","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xb35,pcVar3);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_188);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pDVar4 = std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::operator->
                           ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20);
        local_1c4 = ASN1_STRING_length((ASN1_STRING *)pDVar4->oct);
        local_1c8 = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1c0,"ASN1_STRING_length(obj->oct)","0",&local_1c4,&local_1c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar1) {
          testing::Message::Message(&local_1d0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xb36,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper(&local_1d8);
          testing::Message::~Message(&local_1d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        pDVar4 = std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::get
                           ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20);
        bssl::Span<unsigned_char_const>::Span<15ul>
                  ((Span<unsigned_char_const> *)&local_1e8,&TestBody::kTrueEmpty);
        TestSerialize<DOUBLY_TAGGED*,DOUBLY_TAGGED*>(pDVar4,i2d_DOUBLY_TAGGED,local_1e8);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  std::unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)>::~unique_ptr
            ((unique_ptr<DOUBLY_TAGGED,_void_(*)(DOUBLY_TAGGED_*)> *)local_20);
  return;
}

Assistant:

TEST(ASN1Test, DoublyTagged) {
  std::unique_ptr<DOUBLY_TAGGED, decltype(&DOUBLY_TAGGED_free)> obj(
      nullptr, DOUBLY_TAGGED_free);

  // Both fields missing.
  static const uint8_t kOmitted[] = {0x30, 0x00};
  const uint8_t *inp = kOmitted;
  obj.reset(d2i_DOUBLY_TAGGED(nullptr, &inp, sizeof(kOmitted)));
  ASSERT_TRUE(obj);
  EXPECT_EQ(obj->b, -1);
  EXPECT_FALSE(obj->oct);
  TestSerialize(obj.get(), i2d_DOUBLY_TAGGED, kOmitted);

  // Both fields present, true and the empty string.
  static const uint8_t kTrueEmpty[] = {0x30, 0x0d, 0xa3, 0x05, 0xa1,
                                       0x03, 0x01, 0x01, 0xff, 0xa4,
                                       0x04, 0xa2, 0x02, 0x04, 0x00};
  inp = kTrueEmpty;
  obj.reset(d2i_DOUBLY_TAGGED(nullptr, &inp, sizeof(kTrueEmpty)));
  ASSERT_TRUE(obj);
  EXPECT_EQ(obj->b, 0xff);
  ASSERT_TRUE(obj->oct);
  EXPECT_EQ(ASN1_STRING_length(obj->oct), 0);
  TestSerialize(obj.get(), i2d_DOUBLY_TAGGED, kTrueEmpty);
}